

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  _Bool *p_Var1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var5;
  void *pvVar6;
  curl_off_t *pcVar7;
  curl_off_t cVar8;
  Curl_easy *pCVar9;
  _Bool _Var10;
  char cVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  CHUNKcode code;
  int iVar14;
  long lVar15;
  size_t sVar16;
  char *pcVar17;
  _Bool *p_Var18;
  time_t tVar19;
  size_t sVar20;
  _Bool *p_Var21;
  Curl_easy *pCVar22;
  CURL *pCVar23;
  Curl_handler *pCVar24;
  _Bool *p_Var25;
  ulong uVar26;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong uVar27;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  _Bool *p_Var28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  curl_socket_t readfd0;
  uint uVar32;
  long lVar33;
  anon_union_8_2_1ffdf146_for_data aVar34;
  bool bVar35;
  bool bVar36;
  timeval tVar37;
  _Bool readmore;
  ssize_t bytes_written;
  CURLcode local_64;
  _Bool local_5d;
  CHUNKcode local_5c;
  _Bool *local_58;
  uint local_4c;
  CURL *local_48;
  anon_union_8_2_1ffdf146_for_data local_40;
  _Bool *local_38;
  
  uVar29 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar32 = (data->req).keepon;
  uVar26 = 0xffffffff;
  readfd0 = -1;
  if ((uVar32 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar32 & 0x2a) == 2) {
    uVar26 = (ulong)(uint)conn->writesockfd;
  }
  bVar35 = (conn->data->state).drain != 0;
  CVar12 = (CURLcode)bVar35;
  uVar29 = uVar29 | bVar35;
  if (uVar29 == 0) {
    CVar12 = CURLE_OK;
    uVar29 = Curl_socket_check(readfd0,-1,(curl_socket_t)uVar26,0);
    uVar26 = extraout_RDX;
  }
  if (uVar29 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  local_48 = (CURL *)&data->req;
  uVar32 = 0;
  if ((((data->req).keepon & 1) != 0) &&
     (((uVar29 & 1) != 0 || ((conn->bits).stream_was_rewound == true)))) {
    readmore = false;
    *done = false;
    *comeback = false;
    iVar14 = 100;
    uVar32 = 0;
    local_40.whatever = (void *)0x0;
    CVar13 = CURLE_OK;
    local_58 = done;
    local_4c = uVar29;
    local_38 = comeback;
    do {
      sVar20 = (data->set).buffer_size;
      if (sVar20 == 0) {
        sVar20 = 0x4000;
      }
      lVar15 = (data->req).size;
      if (((lVar15 != -1) && ((data->req).header == false)) &&
         (sVar16 = lVar15 - (data->req).bytecount, (long)sVar16 < (long)sVar20)) {
        sVar20 = sVar16;
      }
      if (sVar20 == 0) {
        bytes_written = 0;
LAB_00126fde:
        if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
           (Curl_pgrsTime(data,TIMER_STARTTRANSFER), uVar26 = extraout_RDX_01,
           (data->req).exp100 != EXP100_SEND_DATA)) {
          tVar37 = curlx_tvnow();
          uVar26 = tVar37.tv_usec;
          (data->req).start100 = tVar37;
        }
        if (bytes_written == 0) {
          uVar26 = CONCAT71((int7)(uVar26 >> 8),(data->req).bodywrites == 0);
        }
        else {
          uVar26 = 0;
        }
        CVar12 = (CURLcode)CONCAT71((int7)(sVar20 >> 8),0 < bytes_written | (byte)uVar26);
        if (0 < bytes_written || (uVar26 & 1) != 0) {
          pCVar22 = (Curl_easy *)(data->req).buf;
          *(undefined1 *)((long)pCVar22->sockets + bytes_written + -0x38) = 0;
          (data->req).str = (data->req).buf;
          p_Var5 = conn->handler->readwrite;
          if (p_Var5 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
LAB_001270ef:
            if ((data->req).header == true) {
              local_5c = (CHUNKcode)uVar26;
              local_5d = false;
              p_Var21 = &local_5d;
              CVar12 = Curl_http_readwrite_headers(data,conn,&bytes_written,p_Var21);
              uVar32 = 1;
              if (CVar12 == CURLE_OK) {
                p_Var5 = conn->handler->readwrite;
                uVar26 = (ulong)(uint)local_5c;
                if (((p_Var5 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr
                                 *)0x0) || (0 < (data->req).maxdownload)) || (bytes_written < 1)) {
LAB_00127278:
                  if (local_5d == true) {
                    iVar31 = 2;
                    if (0 < bytes_written) {
                      _Var10 = Curl_pipeline_wanted(conn->data->multi,1);
                      if (_Var10) {
                        Curl_infof(data,
                                   "Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                                   bytes_written);
                        conn->read_pos = conn->read_pos - bytes_written;
                        (conn->bits).stream_was_rewound = true;
                      }
                      else {
                        Curl_infof(data,
                                   "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                                   ,bytes_written);
                      }
                      CVar13 = CURLE_OK;
                      goto LAB_00127132;
                    }
                    pCVar22 = (Curl_easy *)0x0;
                  }
                  else {
                    iVar31 = 0;
                    pCVar22 = (Curl_easy *)CONCAT71((int7)((ulong)p_Var21 >> 8),1);
                  }
                  CVar13 = CURLE_OK;
                }
                else {
                  p_Var21 = &readmore;
                  CVar12 = (*p_Var5)(data,conn,&bytes_written,p_Var21);
                  CVar13 = CURLE_OK;
                  if (CVar12 != CURLE_OK) goto LAB_0012712e;
                  uVar26 = (ulong)(uint)local_5c;
                  if (readmore == false) goto LAB_00127278;
                  iVar31 = 2;
                  pCVar22 = (Curl_easy *)0x0;
                }
              }
              else {
LAB_0012712e:
                CVar13 = CVar12;
                iVar31 = 1;
                local_64 = CVar13;
LAB_00127132:
                pCVar22 = (Curl_easy *)0x0;
                uVar26 = (ulong)(uint)local_5c;
              }
              CVar12 = (CURLcode)pCVar22;
              if ((char)pCVar22 == '\0') goto LAB_001270a7;
            }
            CVar12 = (CURLcode)pCVar22;
            if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
               (0 < bytes_written || (uVar26 & 1) != 0)) {
              if ((data->set).opt_no_body == true) {
                Curl_conncontrol(conn,2);
                *local_58 = true;
                local_64 = CURLE_WEIRD_SERVER_REPLY;
                uVar26 = extraout_RDX_04;
LAB_0012719c:
                uVar32 = 1;
                iVar31 = 1;
                goto LAB_001270a7;
              }
              if (((data->req).bodywrites == 0 && (uVar26 & 1) == 0) &&
                 ((conn->handler->protocol & 0x40003) != 0)) {
                if ((data->req).newurl != (char *)0x0) {
                  if ((conn->bits).close == true) {
                    piVar2 = &(data->req).keepon;
                    *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                    *local_58 = true;
                    local_64 = CURLE_OK;
                    goto LAB_0012719c;
                  }
                  (data->req).ignorebody = true;
                  uVar26 = uVar26 & 0xffffffff;
                  Curl_infof(data,"Ignoring the response-body\n");
                }
                pCVar9 = (Curl_easy *)(data->state).resume_from;
                if (((pCVar9 != (Curl_easy *)0x0) && ((data->req).content_range == false)) &&
                   (((data->set).httpreq == HTTPREQ_GET && ((data->req).ignorebody == false)))) {
                  if (local_48->next == pCVar9) {
                    local_64 = CURLE_OK;
                    pCVar23 = local_48;
                    Curl_infof(data,"The entire document is already downloaded");
                    CVar12 = (CURLcode)pCVar23;
                    Curl_conncontrol(conn,1);
                    piVar2 = &(data->req).keepon;
                    *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                    *local_58 = true;
                    uVar26 = extraout_RDX_08;
                  }
                  else {
                    pCVar23 = local_48;
                    Curl_failf(data,
                               "HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
                    CVar12 = (CURLcode)pCVar23;
                    local_64 = CURLE_RANGE_ERROR;
                    uVar26 = extraout_RDX_09;
                  }
                  goto LAB_0012719c;
                }
                if (((data->set).timecondition != CURL_TIMECOND_NONE) &&
                   ((data->state).range == (char *)0x0)) {
                  uVar26 = uVar26 & 0xffffffff;
                  _Var10 = Curl_meets_timecondition(data,(data->req).timeofdoc);
                  CVar12 = (CURLcode)pCVar22;
                  if (!_Var10) {
                    *local_58 = true;
                    (data->info).httpcode = 0x130;
                    local_64 = CURLE_OK;
                    Curl_infof(data,"Simulate a HTTP 304 response!\n");
                    Curl_conncontrol(conn,1);
                    uVar26 = extraout_RDX_07;
                    goto LAB_0012719c;
                  }
                }
              }
              plVar3 = &(data->req).bodywrites;
              *plVar3 = *plVar3 + 1;
              uVar27 = uVar26;
              if ((data->set).verbose == true) {
                uVar27 = uVar26 & 0xffffffff;
                if ((data->req).badheader != HEADER_NORMAL) {
                  pCVar22 = (Curl_easy *)(data->req).hbuflen;
                  Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(size_t)pCVar22,conn);
                  if ((data->req).badheader != HEADER_PARTHEADER) goto LAB_001273d5;
                }
                pCVar22 = (Curl_easy *)bytes_written;
                Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written,conn);
              }
LAB_001273d5:
              if ((data->req).chunk == true) {
                uVar26 = uVar27 & 0xffffffff;
                pCVar22 = (Curl_easy *)&bytes_written;
                code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,(ssize_t *)pCVar22);
                if (code < CHUNKE_TOO_LONG_HEX) {
                  if (code == CHUNKE_STOP) {
                    piVar2 = &(data->req).keepon;
                    *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                    sVar20 = (conn->chunk).dataleft;
                    if (sVar20 != 0) {
                      local_5c = code;
                      Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n");
                      _Var10 = Curl_pipeline_wanted(conn->data->multi,1);
                      code = local_5c;
                      if (_Var10) {
                        Curl_infof(conn->data,"Rewinding %zu bytes\n",sVar20);
                        conn->read_pos = conn->read_pos - sVar20;
                        (conn->bits).stream_was_rewound = true;
                        code = local_5c;
                      }
                    }
                  }
                }
                else if (code == CHUNKE_WRITE_ERROR) {
                  Curl_failf(data,"Failed writing data");
                  local_64 = CURLE_WRITE_ERROR;
                }
                else {
                  pcVar17 = Curl_chunked_strerror(code);
                  Curl_failf(data,"%s in chunked-encoding",pcVar17);
                  local_64 = CURLE_RECV_ERROR;
                }
                CVar12 = (CURLcode)pCVar22;
                if (CHUNKE_OK < code) goto LAB_0012719c;
              }
              if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
                pcVar7 = &(data->req).bytecount;
                *pcVar7 = *pcVar7 + (data->req).hbuflen;
              }
              lVar15 = (data->req).maxdownload;
              if (lVar15 != -1) {
                lVar33 = bytes_written + (data->req).bytecount;
                aVar34.whatever = (void *)(lVar33 - lVar15);
                if (lVar15 <= lVar33) {
                  if ((aVar34.whatever != (void *)0x0) && ((data->req).ignorebody == false)) {
                    _Var10 = Curl_pipeline_wanted(conn->data->multi,1);
                    if (_Var10) {
                      Curl_infof(data,
                                 "Rewinding stream by : %zu bytes on url %s (size = %lld, maxdownload = %lld, bytecount = %lld, nread = %zd)\n"
                                 ,aVar34.whatever,(data->state).path,(data->req).size,
                                 (data->req).maxdownload,(data->req).bytecount,bytes_written);
                      conn->read_pos = conn->read_pos - (long)aVar34;
                      (conn->bits).stream_was_rewound = true;
                    }
                    else {
                      Curl_infof(data,
                                 "Excess found in a non pipelined read: excess = %zu, size = %lld, maxdownload = %lld, bytecount = %lld\n"
                                 ,aVar34.whatever,(data->req).size,(data->req).maxdownload,
                                 (data->req).bytecount);
                    }
                  }
                  bytes_written = (data->req).maxdownload - (data->req).bytecount;
                  pCVar22 = (Curl_easy *)0x0;
                  if (bytes_written < 1) {
                    bytes_written = 0;
                  }
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  local_40.whatever = aVar34.whatever;
                }
              }
              lVar15 = (data->req).bytecount + bytes_written;
              (data->req).bytecount = lVar15;
              Curl_pgrsSetDownloadCounter(data,lVar15);
              CVar12 = (CURLcode)pCVar22;
              if ((data->req).chunk == false) {
                uVar26 = uVar27 & 0xffffffff;
                if ((bytes_written != 0) ||
                   ((data->req).badheader != HEADER_NORMAL || (uVar27 & 1) != 0)) {
                  if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false))
                  {
                    pCVar22 = (Curl_easy *)(data->req).maxdownload;
                    if ((pCVar22 == (Curl_easy *)0xffffffffffffffff) ||
                       ((long)(data->req).hbuflen <= (long)pCVar22)) {
                      pcVar17 = (data->state).headerbuff;
                      pCVar22 = (Curl_easy *)(data->req).hbuflen;
                    }
                    else {
                      pcVar17 = (data->state).headerbuff;
                    }
                    CVar13 = Curl_client_write(conn,1,pcVar17,(size_t)pCVar22);
                    CVar12 = (CURLcode)pCVar22;
                    uVar32 = 1;
                    uVar26 = extraout_RDX_06;
                    if (CVar13 != CURLE_OK) goto LAB_00126fc6;
                    CVar13 = CURLE_OK;
                  }
                  uVar26 = uVar27 & 0xffffffff;
                  if ((data->req).badheader < HEADER_ALLBAD) {
                    pCVar22 = conn->data;
                    iVar31 = 0;
                    if ((pCVar22->set).http_ce_skip == false) {
                      iVar31 = (data->req).auto_decoding;
                    }
                    if (iVar31 == 2) {
                      if ((data->req).ignorebody == false) {
                        CVar13 = Curl_unencode_gzip_write
                                           (conn,(SingleRequest *)local_48,bytes_written);
                      }
                    }
                    else if (iVar31 == 1) {
                      if ((data->req).ignorebody == false) {
                        CVar13 = Curl_unencode_deflate_write
                                           (conn,(SingleRequest *)local_48,bytes_written);
                      }
                    }
                    else if (iVar31 == 0) {
                      if ((data->req).ignorebody == false) {
                        pcVar17 = (data->req).str;
                        pCVar22 = (Curl_easy *)bytes_written;
                        if ((conn->handler->protocol & 0xc000) == 0) {
                          CVar13 = Curl_client_write(conn,1,pcVar17,bytes_written);
                        }
                        else {
                          CVar13 = Curl_pop3_write(conn,pcVar17,bytes_written);
                        }
                      }
                    }
                    else {
                      Curl_failf(data,
                                 "Unrecognized content encoding type. libcurl understands `identity\', `deflate\' and `gzip\' content encodings."
                                );
                      CVar13 = CURLE_BAD_CONTENT_ENCODING;
                    }
                  }
                  CVar12 = (CURLcode)pCVar22;
                  (data->req).badheader = HEADER_NORMAL;
                  uVar32 = 1;
                  if (CVar13 != CURLE_OK) goto LAB_00126fc6;
                  CVar13 = CURLE_OK;
                }
              }
              else {
                uVar26 = uVar27 & 0xffffffff;
              }
            }
            p_Var5 = conn->handler->readwrite;
            if (((p_Var5 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                            0x0) || (local_40.whatever == (void *)0x0)) ||
               ((conn->bits).stream_was_rewound != false)) {
              iVar31 = 0;
              uVar32 = 1;
              if ((char)uVar26 != '\0') {
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              }
            }
            else {
              ppcVar4 = &(data->req).str;
              *ppcVar4 = *ppcVar4 + bytes_written;
              bytes_written = (ssize_t)local_40;
              p_Var21 = &readmore;
              CVar13 = (*p_Var5)(data,conn,&bytes_written,p_Var21);
              CVar12 = (CURLcode)p_Var21;
              uVar32 = 1;
              uVar26 = extraout_RDX_05;
              if (CVar13 != CURLE_OK) goto LAB_00126fc6;
              CVar13 = CURLE_OK;
              iVar31 = 2;
              if (readmore == true) {
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 | 1;
              }
            }
            goto LAB_001270a7;
          }
          uVar26 = uVar26 & 0xffffffff;
          pCVar22 = (Curl_easy *)&readmore;
          CVar13 = (*p_Var5)(data,conn,&bytes_written,(_Bool *)pCVar22);
          CVar12 = (CURLcode)pCVar22;
          if (CVar13 == CURLE_OK) {
            CVar13 = CURLE_OK;
            iVar31 = 2;
            if (readmore == false) goto LAB_001270ef;
          }
          else {
            iVar31 = 1;
            uVar26 = extraout_RDX_02;
            local_64 = CVar13;
          }
        }
        else {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          iVar31 = 2;
        }
        uVar32 = 1;
      }
      else {
        CVar13 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar20,&bytes_written);
        CVar12 = (CURLcode)sVar20;
        uVar26 = extraout_RDX_00;
        if (CVar13 == CURLE_OK) goto LAB_00126fde;
        iVar31 = 2;
        if (CVar13 != CURLE_AGAIN) {
LAB_00126fc6:
          iVar31 = 1;
          local_64 = CVar13;
        }
      }
LAB_001270a7:
      if (iVar31 != 0) {
        done = local_58;
        uVar29 = local_4c;
        CVar13 = local_64;
        if (iVar31 != 2) goto LAB_00127977;
        goto LAB_00127920;
      }
      if (((conn->handler->protocol & 0x30) == 0) &&
         (_Var10 = Curl_ssl_data_pending(conn,0), uVar26 = extraout_RDX_03, !_Var10))
      goto LAB_00127920;
      bVar35 = iVar14 != 0;
      iVar14 = iVar14 + -1;
    } while (bVar35);
    iVar14 = -1;
LAB_00127920:
    uVar29 = local_4c;
    done = local_58;
    if (iVar14 < 1) {
      conn->cselect_bits = 1;
      *local_38 = true;
    }
    CVar13 = CURLE_OK;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      CVar13 = CURLE_OK;
    }
LAB_00127977:
    if (CVar13 != CURLE_OK) {
      return CVar13;
    }
    if (*done != false) {
      return CURLE_OK;
    }
  }
  uVar30 = uVar32;
  if ((uVar29 & (data->req).keepon & 2) == 0) goto LAB_00127bbe;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar30 = uVar32 | 2;
  if ((data->req).upload_present == 0) {
    (data->req).upload_fromhere = (data->req).uploadbuf;
    if ((data->req).upload_done == false) {
      pvVar6 = (data->req).protop;
      p_Var21 = done;
      if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar6 + 0x78) == 2)) {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
        tVar37 = curlx_tvnow();
        (data->req).start100 = tVar37;
        Curl_expire(data,(data->set).expect_100_timeout);
        cVar11 = '\x02';
        bVar35 = false;
        uVar30 = uVar32;
      }
      else {
        pCVar24 = conn->handler;
        if ((pCVar24->protocol & 0x40003) == 0) {
          bVar35 = false;
        }
        else {
          bVar35 = *(int *)((long)pvVar6 + 0x78) == 1;
        }
        CVar12 = Curl_fillreadbuffer(conn,0x4000,(int *)&bytes_written);
        bVar36 = CVar12 == CURLE_OK;
        if (bVar36) {
          p_Var21 = (_Bool *)(long)(int)bytes_written;
          CVar12 = (CURLcode)pCVar24;
        }
        cVar11 = !bVar36;
      }
      if (cVar11 != '\x02') {
        if (cVar11 == '\0') goto LAB_00127a6a;
        goto LAB_00127bad;
      }
      goto LAB_00127bab;
    }
    p_Var21 = (_Bool *)0x0;
    bVar35 = false;
LAB_00127a6a:
    if ((p_Var21 == (_Bool *)0x0) && (((data->req).keepon & 0x20) != 0)) goto LAB_00127bab;
    if ((long)p_Var21 < 1) {
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      if (((conn->bits).rewindaftersend != true) ||
         (CVar12 = Curl_readrewind(conn), CVar12 == CURLE_OK)) {
        CVar12 = CURLE_OK;
      }
      if (CVar12 == CURLE_OK) goto LAB_00127bab;
    }
    else {
      (data->req).upload_present = (ssize_t)p_Var21;
      if ((!bVar35) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
        if ((data->state).scratch == (char *)0x0) {
          pcVar17 = (char *)(*Curl_cmalloc)(0x8000);
          (data->state).scratch = pcVar17;
          if (pcVar17 == (char *)0x0) {
            Curl_failf(data,"Failed to alloc scratch buffer!");
            CVar12 = CURLE_OUT_OF_MEMORY;
            goto LAB_00127bad;
          }
        }
        p_Var18 = (_Bool *)0x1;
        if (1 < (long)p_Var21) {
          p_Var18 = p_Var21;
        }
        p_Var25 = (_Bool *)0x0;
        p_Var28 = (_Bool *)0x0;
        do {
          cVar11 = (data->req).upload_fromhere[(long)p_Var25];
          pcVar17 = (data->state).scratch;
          if (cVar11 == '\n') {
            p_Var1 = p_Var28 + 1;
            pcVar17[(long)p_Var28] = '\r';
            ((data->state).scratch + 1)[(long)p_Var28] = '\n';
            p_Var28 = p_Var1;
            if (((data->set).crlf == false) && (lVar15 = (data->state).infilesize, lVar15 != -1)) {
              (data->state).infilesize = lVar15 + 1;
            }
          }
          else {
            pcVar17[(long)p_Var28] = cVar11;
          }
          p_Var25 = p_Var25 + 1;
          p_Var28 = p_Var28 + 1;
        } while (p_Var18 != p_Var25);
        if (p_Var28 != p_Var21) {
          (data->req).upload_fromhere = (data->state).scratch;
          (data->req).upload_present = (ssize_t)p_Var28;
          p_Var21 = p_Var28;
        }
      }
      if (((conn->handler->protocol & 0x30000) == 0) ||
         (CVar12 = Curl_smtp_escape_eob(conn,(ssize_t)p_Var21), CVar12 == CURLE_OK))
      goto LAB_00126e2a;
    }
  }
  else {
LAB_00126e2a:
    CVar12 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                        (data->req).upload_present,&bytes_written);
    if (CVar12 != CURLE_OK) goto LAB_00127bad;
    if ((data->set).verbose == true) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written,conn);
    }
    lVar15 = (data->req).writebytecount + bytes_written;
    (data->req).writebytecount = lVar15;
    if (lVar15 == (data->state).infilesize) {
      (data->req).upload_done = true;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar15 = (data->req).upload_present - bytes_written;
    if (lVar15 == 0) {
      (data->req).upload_fromhere = (data->req).uploadbuf;
      (data->req).upload_present = 0;
      if ((data->req).upload_done == true) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
        if (((conn->bits).rewindaftersend != true) ||
           (CVar12 = Curl_readrewind(conn), CVar12 == CURLE_OK)) {
          CVar12 = CURLE_OK;
        }
        if (CVar12 != CURLE_OK) goto LAB_00127bad;
      }
    }
    else {
      (data->req).upload_present = lVar15;
      ppcVar4 = &(data->req).upload_fromhere;
      *ppcVar4 = *ppcVar4 + bytes_written;
    }
    Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
LAB_00127bab:
    CVar12 = CURLE_OK;
  }
LAB_00127bad:
  if (CVar12 != CURLE_OK) {
    return CVar12;
  }
LAB_00127bbe:
  tVar37 = curlx_tvnow();
  (data->req).now = tVar37;
  if (uVar30 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (tVar19 = curlx_tvdiff(tVar37,(data->req).start100), (data->set).expect_100_timeout <= tVar19
       )) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar7 = (data->req).bytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).bytecount;
    }
    pcVar7 = (data->req).writebytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).writebytecount;
    }
  }
  iVar14 = Curl_pgrsUpdate(conn);
  CVar12 = CURLE_ABORTED_BY_CALLBACK;
  if (iVar14 == 0) {
    CVar12 = Curl_speedcheck(data,(data->req).now);
  }
  if (CVar12 == CURLE_OK) {
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        pCVar22 = local_48->next;
        if ((((pCVar22 != (Curl_easy *)0xffffffffffffffff) &&
             (pCVar9 = (Curl_easy *)(data->req).bytecount, pCVar22 != pCVar9)) &&
            (pCVar9 != (Curl_easy *)
                       ((long)pCVar22->sockets + (data->state).crlf_conversions + -0x38))) &&
           ((data->req).newurl == (char *)0x0)) {
          Curl_failf(data,"transfer closed with %lld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar14 = Curl_pgrsUpdate(conn);
      if (iVar14 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar19 = Curl_timeleft(data,&(data->req).now,false);
      if (tVar19 < 0) {
        lVar15 = (data->req).size;
        tVar19 = curlx_tvdiff((data->req).now,(data->progress).t_startsingle);
        cVar8 = (data->req).bytecount;
        if (lVar15 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %lld bytes received",
                     tVar19,cVar8);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %lld out of %lld bytes received"
                     ,tVar19,cVar8,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CVar12;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, k, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      time_t ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !data->req.newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read",
            k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    else if(!(data->set.opt_no_body) &&
            k->chunk &&
            (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}